

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward_int8_x86
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  undefined4 uVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  int *piVar13;
  Layer *pLVar14;
  uint uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined4 uVar20;
  undefined1 auVar21 [14];
  undefined1 auVar22 [12];
  unkbyte10 Var23;
  undefined1 auVar24 [14];
  undefined1 auVar25 [12];
  unkbyte10 Var26;
  undefined1 auVar27 [12];
  int iVar28;
  size_t sVar29;
  undefined8 uVar30;
  undefined1 uVar31;
  long lVar32;
  void *pvVar33;
  float *pfVar34;
  int g_2;
  uint uVar35;
  int iVar36;
  uint _elempack;
  undefined4 *puVar37;
  long lVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  long lVar43;
  ulong uVar44;
  _Vector_base<float,_std::allocator<float>_> *this_00;
  long lVar45;
  undefined1 (*pauVar46) [16];
  undefined1 (*pauVar47) [16];
  long lVar48;
  int remain;
  int iVar49;
  int iVar50;
  void *pvVar51;
  int k;
  ulong uVar52;
  int iVar53;
  uint uVar54;
  undefined1 *puVar55;
  int g;
  ulong uVar56;
  void *pvVar57;
  long lVar58;
  int remain_1;
  uint uVar59;
  ulong uVar60;
  bool bVar61;
  undefined1 extraout_var [12];
  undefined4 uVar62;
  undefined1 auVar63 [16];
  ushort uVar64;
  float fVar65;
  ushort uVar72;
  int iVar73;
  ushort uVar76;
  float fVar77;
  ushort uVar79;
  int iVar80;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar74;
  float fVar81;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  ushort uVar71;
  ushort uVar75;
  ushort uVar78;
  ushort uVar82;
  undefined1 auVar70 [16];
  int iVar84;
  float fVar85;
  int iVar93;
  int iVar95;
  undefined1 in_XMM4 [16];
  int iVar97;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar94;
  float fVar96;
  float fVar98;
  undefined1 auVar92 [16];
  char cVar115;
  char cVar116;
  char cVar117;
  char cVar118;
  char cVar119;
  char cVar120;
  __m128 pos_1;
  undefined1 auVar99 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar121;
  float fVar136;
  float fVar137;
  __m128 max;
  undefined1 auVar122 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar138;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  int iVar139;
  short sVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar142 [16];
  __m128 pos;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar150;
  float fVar151;
  float fVar152;
  v4sf one;
  float fVar153;
  float *local_340;
  void *local_338;
  undefined4 *local_330;
  long local_328;
  int local_2fc;
  Mat local_2c8;
  long local_280;
  Option opt_q;
  float top_rescale;
  int iStack_224;
  Allocator *pAStack_220;
  Allocator *local_218;
  int iStack_210;
  undefined4 uStack_20c;
  Allocator *local_208;
  int iStack_200;
  int iStack_1fc;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  undefined4 uStack_1ec;
  size_t local_1e8;
  undefined1 local_1d8 [16];
  pointer local_1c8;
  long local_1c0;
  undefined4 *local_1b8;
  float scale_out;
  undefined4 uStack_1ac;
  int *local_1a8;
  Allocator *local_1a0;
  int local_198;
  long *local_190;
  int local_188;
  bool local_184;
  bool bStack_183;
  bool bStack_182;
  bool bStack_181;
  int local_180;
  bool local_17c;
  bool bStack_17b;
  bool bStack_17a;
  bool bStack_179;
  int local_178;
  ulong local_170;
  Mat local_168;
  Mat m_1;
  _Vector_base<float,_std::allocator<float>_> local_d8;
  _Vector_base<float,_std::allocator<float>_> local_c0;
  _Vector_base<float,_std::allocator<float>_> local_a8;
  _Vector_base<float,_std::allocator<float>_> local_90;
  Option opt_g;
  short sVar83;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar140 [12];
  undefined1 auVar141 [16];
  
  local_168.c = bottom_blob->c;
  local_168.elempack = bottom_blob->elempack;
  local_168.elemsize = bottom_blob->elemsize;
  iVar36 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar40 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar39 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar50 = (this->super_ConvolutionDepthWise).dilation_h;
  local_168.data = bottom_blob->data;
  local_168.refcount = bottom_blob->refcount;
  local_168.allocator = bottom_blob->allocator;
  local_168.dims = bottom_blob->dims;
  local_168.w = bottom_blob->w;
  local_168.h = bottom_blob->h;
  local_168.d = bottom_blob->d;
  local_168.cstep = bottom_blob->cstep;
  if (local_168.refcount != (int *)0x0) {
    LOCK();
    *local_168.refcount = *local_168.refcount + 1;
    UNLOCK();
  }
  if (local_168.elempack == 0 || ((int)local_168.elemsize * 8) / local_168.elempack != 8) {
    iVar53 = local_168.elempack * local_168.c;
    iVar42 = (this->super_ConvolutionDepthWise).group;
    local_2c8.cstep = 0;
    local_2c8.data = (undefined4 *)0x0;
    local_2c8.refcount._0_4_ = 0;
    local_2c8.refcount._4_4_ = 0;
    local_2c8.elemsize._0_4_ = 0;
    local_2c8.elemsize._4_4_ = 0;
    local_2c8.elempack = 0;
    local_2c8.allocator = (Allocator *)0x0;
    local_2c8.dims = 0;
    local_2c8.w = 0;
    local_2c8.h = 0;
    local_2c8.d = 0;
    local_2c8.c = 0;
    uVar56 = 0;
    Mat::create(&local_2c8,iVar53,4,(Allocator *)0x0);
    iVar53 = iVar53 / iVar42;
    uVar54 = (this->super_ConvolutionDepthWise).group;
    if (iVar53 < 1) {
      iVar53 = 0;
    }
    pvVar10 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
    puVar37 = (undefined4 *)local_2c8.data;
    uVar60 = (ulong)uVar54;
    if ((int)uVar54 < 1) {
      uVar60 = uVar56;
    }
    for (; uVar56 != uVar60; uVar56 = uVar56 + 1) {
      uVar62 = *(undefined4 *)((long)pvVar10 + uVar56 * 4);
      iVar42 = iVar53;
      while (bVar61 = iVar42 != 0, iVar42 = iVar42 + -1, bVar61) {
        *puVar37 = uVar62;
        puVar37 = puVar37 + 1;
      }
    }
    uVar16 = opt->lightmode;
    uVar17 = opt->use_shader_pack8;
    uVar18 = opt->use_subgroup_ops;
    uVar19 = opt->use_reserved_0;
    uVar20 = opt->num_threads;
    opt_q.num_threads = uVar20;
    opt_q.use_reserved_0 = (bool)uVar19;
    opt_q.use_subgroup_ops = (bool)uVar18;
    opt_q.use_shader_pack8 = (bool)uVar17;
    opt_q.lightmode = (bool)uVar16;
    opt_q.workspace_allocator = opt->workspace_allocator;
    opt_q.openmp_blocktime = opt->openmp_blocktime;
    opt_q.use_winograd_convolution = opt->use_winograd_convolution;
    opt_q.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_q.use_int8_inference = opt->use_int8_inference;
    opt_q.use_vulkan_compute = opt->use_vulkan_compute;
    opt_q.use_bf16_storage = opt->use_bf16_storage;
    opt_q.use_fp16_packed = opt->use_fp16_packed;
    opt_q.use_fp16_storage = opt->use_fp16_storage;
    opt_q.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_q.use_int8_packed = opt->use_int8_packed;
    opt_q.use_int8_storage = opt->use_int8_storage;
    opt_q.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_q.use_packing_layout = opt->use_packing_layout;
    opt_q.vulkan_device_index = opt->vulkan_device_index;
    opt_q.use_reserved_1 = opt->use_reserved_1;
    opt_q.use_image_storage = opt->use_image_storage;
    opt_q.use_tensor_storage = opt->use_tensor_storage;
    opt_q.use_reserved_2 = opt->use_reserved_2;
    opt_q.flush_denormals = opt->flush_denormals;
    opt_q.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_q.use_shader_local_memory = opt->use_shader_local_memory;
    opt_q.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_q.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_q.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_q.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_q.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_q.use_fp16_uniform = opt->use_fp16_uniform;
    opt_q.use_int8_uniform = opt->use_int8_uniform;
    opt_q.use_reserved_9 = opt->use_reserved_9;
    opt_q.use_reserved_10 = opt->use_reserved_10;
    opt_q.use_reserved_11 = opt->use_reserved_11;
    opt_q.blob_allocator = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_168,&local_2c8,&opt_q);
    bVar61 = local_168.data == (void *)0x0;
    local_2fc = -100;
    lVar43 = (long)local_168.c * local_168.cstep;
    piVar13 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_2c8.allocator == (Allocator *)0x0) {
          free(local_2c8.data);
        }
        else {
          (*(local_2c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (bVar61 || lVar43 == 0) goto LAB_0039d2df;
  }
  local_2c8.cstep = 0;
  local_2c8.data = (undefined4 *)0x0;
  local_2c8.refcount._0_4_ = 0;
  local_2c8.refcount._4_4_ = 0;
  local_2c8.elemsize._0_4_ = 0;
  local_2c8.elemsize._4_4_ = 0;
  local_2c8.elempack = 0;
  local_2c8.allocator = (Allocator *)0x0;
  local_2c8.dims = 0;
  local_2c8.w = 0;
  local_2c8.h = 0;
  local_2c8.d = 0;
  local_2c8.c = 0;
  ConvolutionDepthWise::make_padding(&this->super_ConvolutionDepthWise,&local_168,&local_2c8,opt);
  uVar54 = local_2c8.c;
  iVar73 = local_2c8.w;
  iVar53 = local_2c8.elempack;
  local_2fc = -100;
  iVar42 = -100;
  if (((undefined4 *)local_2c8.data != (undefined4 *)0x0) &&
     (local_2c8.cstep * (long)local_2c8.c != 0)) {
    iVar39 = (~((iVar36 + -1) * iVar39) + local_2c8.w) / (this->super_ConvolutionDepthWise).stride_w
    ;
    iVar36 = (~((iVar40 + -1) * iVar50) + local_2c8.h) / (this->super_ConvolutionDepthWise).stride_h
    ;
    iVar40 = iVar39 + 1;
    iVar50 = iVar36 + 1;
    uVar35 = local_2c8.elempack * local_2c8.c;
    uVar59 = 8;
    iVar42 = local_2fc;
    if ((uVar35 == (this->super_ConvolutionDepthWise).group) &&
       (uVar35 == (this->super_ConvolutionDepthWise).num_output)) {
      if (opt->use_packing_layout == false) {
        uVar59 = 1;
      }
      if ((uVar35 & 7) != 0) {
        uVar59 = 1;
      }
      iVar49 = (this->super_ConvolutionDepthWise).int8_scale_term;
      uVar15 = uVar59 * 4;
      if (100 < iVar49) {
        uVar15 = uVar59;
      }
      Mat::create(top_blob,iVar40,iVar50,(int)uVar35 / (int)uVar59,(ulong)uVar15,uVar59,
                  opt->blob_allocator);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        local_2fc = 0;
        iVar42 = local_2fc;
        if (iVar53 == 1) {
          iVar50 = (this->super_ConvolutionDepthWise).kernel_w;
          iVar53 = (this->super_ConvolutionDepthWise).kernel_h;
          uVar6 = (this->super_ConvolutionDepthWise).dilation_w;
          uVar7 = (this->super_ConvolutionDepthWise).dilation_h;
          uVar8 = (this->super_ConvolutionDepthWise).stride_w;
          uVar9 = (this->super_ConvolutionDepthWise).stride_h;
          uVar54 = (this->super_ConvolutionDepthWise).activation_type;
          auVar63._0_4_ = -(uint)(uVar6 == 1);
          auVar63._4_4_ = -(uint)(uVar7 == 1);
          auVar63._8_4_ = -(uint)(uVar8 == 1);
          auVar63._12_4_ = -(uint)(uVar9 == 1);
          iVar40 = movmskps(iVar40,auVar63);
          if ((1 < uVar54 || (iVar53 != 3 || iVar50 != 3)) || iVar40 != 0xf) {
            if ((((uVar9 != 2 || uVar8 != 2) || (iVar53 != 3 || iVar50 != 3)) || 1 < uVar54) ||
                (~(byte)iVar40 & 3) != 0) {
              uVar54 = iVar53 * iVar50;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar54,
                         (allocator_type *)&top_rescale);
              iVar40 = (this->super_ConvolutionDepthWise).dilation_h;
              uVar30 = opt_q._0_8_;
              iVar50 = (this->super_ConvolutionDepthWise).kernel_w;
              iVar42 = (this->super_ConvolutionDepthWise).dilation_w * iVar50;
              lVar43 = 0;
              iVar53 = 0;
              for (iVar41 = 0; iVar41 < (this->super_ConvolutionDepthWise).kernel_h;
                  iVar41 = iVar41 + 1) {
                for (lVar45 = 0; (int)lVar45 < iVar50; lVar45 = lVar45 + 1) {
                  *(int *)(opt_q._0_8_ + (long)(int)lVar43 * 4 + lVar45 * 4) = iVar53;
                  iVar53 = iVar53 + (this->super_ConvolutionDepthWise).dilation_w;
                  iVar50 = (this->super_ConvolutionDepthWise).kernel_w;
                }
                iVar53 = iVar53 + (iVar73 * iVar40 - iVar42);
                lVar43 = (int)lVar43 + lVar45;
              }
              local_328 = 0;
              uVar59 = uVar54;
              if ((int)uVar54 < 1) {
                uVar59 = 0;
              }
              for (lVar43 = 0; pvVar10 = local_2c8.data,
                  lVar43 < (this->super_ConvolutionDepthWise).group; lVar43 = lVar43 + 1) {
                pfVar34 = (float *)(top_blob->elemsize * lVar43 * top_blob->cstep +
                                   (long)top_blob->data);
                lVar38 = (long)local_2c8.w;
                lVar48 = local_2c8.cstep * lVar43;
                lVar45 = CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize);
                pvVar11 = (this->weight_data_tm).data;
                local_340 = pfVar34;
                for (iVar40 = 0; iVar40 <= iVar36; iVar40 = iVar40 + 1) {
                  for (iVar50 = 0; iVar50 <= iVar39; iVar50 = iVar50 + 1) {
                    iVar42 = 0;
                    for (uVar56 = 0; uVar59 != uVar56; uVar56 = uVar56 + 1) {
                      iVar42 = iVar42 + (int)*(char *)((long)pvVar11 + uVar56 + local_328) *
                                        (int)*(char *)((long)pvVar10 +
                                                      (long)*(int *)(uVar30 + uVar56 * 4) +
                                                      (long)iVar40 *
                                                      (long)(this->super_ConvolutionDepthWise).
                                                            stride_h * lVar38 * lVar45 +
                                                      (long)iVar50 *
                                                      (long)(this->super_ConvolutionDepthWise).
                                                            stride_w + lVar48 * lVar45);
                    }
                    fVar150 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                               weight_data_int8_scales.data + lVar43 * 4);
                    fVar151 = 0.0;
                    if (fVar150 != 0.0) {
                      fVar151 = 1.0 / (fVar150 *
                                      *(float *)((long)(this->super_ConvolutionDepthWise).
                                                       bottom_blob_int8_scales.data + lVar43 * 4));
                    }
                    fVar151 = (float)iVar42 * fVar151;
                    if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                      fVar151 = fVar151 + *(float *)((long)(this->super_ConvolutionDepthWise).
                                                           bias_data.data + lVar43 * 4);
                    }
                    in_XMM4._0_4_ = fVar151;
                    auVar69 = in_XMM4;
                    switch((this->super_ConvolutionDepthWise).activation_type) {
                    case 1:
                      if (fVar151 <= 0.0) {
                        auVar132._12_4_ = 0;
                        auVar132._0_12_ = in_XMM4._4_12_;
                        auVar69 = auVar132 << 0x20;
                        in_XMM4 = auVar69;
                      }
                      break;
                    case 2:
                      auVar69 = ZEXT416((uint)((float)(~-(uint)(0.0 < fVar151) &
                                                       *(this->super_ConvolutionDepthWise).
                                                        activation_params.data |
                                                      -(uint)(0.0 < fVar151) & 0x3f800000) * fVar151
                                              ));
                      break;
                    case 3:
                      pfVar1 = (float *)(this->super_ConvolutionDepthWise).activation_params.data;
                      fVar150 = *pfVar1;
                      if (fVar151 <= fVar150) {
                        in_XMM4._0_4_ = fVar150;
                      }
                      fVar151 = pfVar1[1];
                      auVar69 = in_XMM4;
                      if (fVar151 < in_XMM4._0_4_) {
LAB_0039c620:
                        auVar69 = ZEXT416((uint)fVar151);
                      }
                      break;
                    case 4:
                      if (88.37626 <= fVar151) {
                        in_XMM4._0_4_ = 0x42b0c0a5;
                      }
                      uVar35 = -(uint)(in_XMM4._0_4_ < -88.37626);
                      auVar130._0_4_ = ~uVar35 & (uint)-in_XMM4._0_4_;
                      auVar130._4_4_ = ~in_XMM4._4_4_ & (in_XMM4._4_4_ ^ 0x80000000);
                      auVar130._8_4_ = ~in_XMM4._8_4_ & (in_XMM4._8_4_ ^ 0x80000000);
                      auVar130._12_4_ = ~in_XMM4._12_4_ & (in_XMM4._12_4_ ^ 0x80000000);
                      in_XMM4 = ZEXT416(uVar35 & 0x42b0c0a5) | auVar130;
                      fVar150 = expf(in_XMM4._0_4_);
                      auVar69 = ZEXT416((uint)(1.0 / (fVar150 + 1.0)));
                      break;
                    case 5:
                      local_1d8 = in_XMM4;
                      fVar150 = expf(fVar151);
                      fVar150 = logf(fVar150 + 1.0);
                      fVar150 = tanhf(fVar150);
                      auVar69._0_4_ = fVar150 * (float)local_1d8._0_4_;
                      auVar69._4_12_ = extraout_var;
                      break;
                    case 6:
                      pfVar1 = (float *)(this->super_ConvolutionDepthWise).activation_params.data;
                      fVar150 = *pfVar1;
                      fVar152 = pfVar1[1];
                      fVar153 = -fVar152 / fVar150;
                      auVar69 = ZEXT816(0);
                      if ((fVar153 <= fVar151) &&
                         (auVar69 = in_XMM4, fVar151 <= fVar153 + 1.0 / fVar150)) {
                        fVar151 = (fVar150 * fVar151 + fVar152) * fVar151;
                        goto LAB_0039c620;
                      }
                    }
                    if (iVar49 < 0x65) {
                      *local_340 = auVar69._0_4_;
                      local_340 = local_340 + 1;
                    }
                    else {
                      fVar150 = roundf(auVar69._0_4_ *
                                       *(float *)((long)(this->super_ConvolutionDepthWise).
                                                        top_blob_int8_scales.data + lVar43 * 4));
                      iVar42 = (int)fVar150;
                      if (iVar42 < -0x7e) {
                        iVar42 = -0x7f;
                      }
                      uVar31 = (undefined1)iVar42;
                      if (0x7e < iVar42) {
                        uVar31 = 0x7f;
                      }
                      *(undefined1 *)pfVar34 = uVar31;
                      pfVar34 = (float *)((long)pfVar34 + 1);
                    }
                  }
                }
                local_328 = local_328 + (int)uVar54;
              }
              goto LAB_0039c6a0;
            }
            if (iVar49 < 0x65) {
              opt_q.workspace_allocator = (Allocator *)0x0;
              opt_q.lightmode = false;
              opt_q.use_shader_pack8 = false;
              opt_q.use_subgroup_ops = false;
              opt_q.use_reserved_0 = false;
              opt_q.num_threads = 0;
              opt_q.blob_allocator = (Allocator *)0x0;
              lVar43 = 0;
              while( true ) {
                if ((this->super_ConvolutionDepthWise).group <= lVar43) break;
                _top_rescale = (void *)CONCAT44(iStack_224,
                                                1.0 / (*(float *)((long)(this->
                                                  super_ConvolutionDepthWise).
                                                  weight_data_int8_scales.data + lVar43 * 4) *
                                                  *(float *)((long)(this->super_ConvolutionDepthWise
                                                                   ).bottom_blob_int8_scales.data +
                                                            lVar43 * 4)));
                std::vector<float,_std::allocator<float>_>::push_back
                          ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
                lVar43 = lVar43 + 1;
              }
              std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)&local_d8,
                         (vector<float,_std::allocator<float>_> *)&opt_q);
              iVar36 = top_blob->w;
              iVar40 = top_blob->h;
              pvVar10 = (this->super_ConvolutionDepthWise).bias_data.data;
              pvVar11 = (this->weight_data_tm).data;
              local_1d8._0_8_ = top_blob->elemsize;
              lVar43 = top_blob->cstep * local_1d8._0_8_;
              iVar39 = 0;
              if (0 < iVar40) {
                iVar39 = iVar40;
              }
              iVar50 = top_blob->d;
              pvVar12 = top_blob->data;
              lVar45 = (long)((local_2c8.w - iVar36) * 2);
              uVar54 = top_blob->c;
              if (top_blob->c < 1) {
                uVar54 = 0;
              }
              iVar53 = top_blob->dims;
              local_280 = CONCAT44(local_280._4_4_,iVar53);
              local_1b8 = (undefined4 *)local_2c8.data;
              local_1c0 = (long)local_2c8.w * 2;
              local_1c8 = local_d8._M_impl.super__Vector_impl_data._M_start;
              pvVar51 = pvVar12;
              for (uVar56 = 0; uVar56 != uVar54; uVar56 = uVar56 + 1) {
                iVar73 = (int)((local_1d8._0_8_ * (long)iVar40 * (long)iVar36 + 0xfU &
                               0xfffffffffffffff0) / (ulong)local_1d8._0_8_);
                if (iVar53 == 4) {
                  iVar73 = (int)((long)iVar40 * (long)iVar36);
                }
                if (pvVar10 == (void *)0x0) {
                  uVar62 = 0;
                }
                else {
                  uVar62 = *(undefined4 *)((long)pvVar10 + uVar56 * 4);
                }
                pfVar34 = (float *)(lVar43 * uVar56 + (long)pvVar12);
                fVar150 = local_d8._M_impl.super__Vector_impl_data._M_start[uVar56];
                iVar73 = iVar73 * iVar50;
                if (iVar73 < 1) {
                  iVar73 = 0;
                }
                for (lVar38 = 0; iVar73 != (int)lVar38; lVar38 = lVar38 + 1) {
                  *(undefined4 *)((long)pvVar51 + lVar38 * 4) = uVar62;
                }
                lVar58 = uVar56 * 9;
                puVar37 = (undefined4 *)
                          (CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize) *
                           local_2c8.cstep * uVar56 + (long)local_2c8.data);
                lVar38 = (long)puVar37 + (long)local_2c8.w;
                lVar48 = (long)puVar37 + local_1c0;
                for (iVar73 = 0; iVar73 != iVar39; iVar73 = iVar73 + 1) {
                  lVar32 = 0;
                  for (iVar49 = iVar36; 0 < iVar49; iVar49 = iVar49 + -1) {
                    *pfVar34 = (float)((int)*(char *)((long)pvVar11 + lVar58 + 8) *
                                       (int)*(char *)(lVar48 + 2 + lVar32) +
                                       (int)*(char *)((long)pvVar11 + lVar58 + 7) *
                                       (int)*(char *)(lVar48 + 1 + lVar32) +
                                      (int)*(char *)((long)pvVar11 + lVar58 + 6) *
                                      (int)*(char *)(lVar48 + lVar32) +
                                      (int)*(char *)((long)pvVar11 + lVar58 + 5) *
                                      (int)*(char *)(lVar38 + 2 + lVar32) +
                                      (int)*(char *)((long)pvVar11 + lVar58 + 4) *
                                      (int)*(char *)(lVar38 + 1 + lVar32) +
                                      (int)*(char *)((long)pvVar11 + lVar58 + 3) *
                                      (int)*(char *)(lVar38 + lVar32) +
                                      (int)*(char *)((long)pvVar11 + lVar58 + 2) *
                                      (int)*(char *)((long)puVar37 + lVar32 + 2) +
                                      (int)*(char *)((long)pvVar11 + lVar58 + 1) *
                                      (int)*(char *)((long)puVar37 + lVar32 + 1) +
                                      (int)*(char *)((long)pvVar11 + lVar58) *
                                      (int)*(char *)((long)puVar37 + lVar32)) * fVar150 + *pfVar34;
                    pfVar34 = pfVar34 + 1;
                    lVar32 = lVar32 + 2;
                  }
                  puVar37 = (undefined4 *)((long)puVar37 + lVar32 + lVar45);
                  lVar38 = lVar38 + lVar45 + lVar32;
                  lVar48 = lVar48 + lVar45 + lVar32;
                }
                pvVar51 = (void *)((long)pvVar51 + lVar43);
              }
              this_00 = &local_d8;
            }
            else {
              opt_q.lightmode = false;
              opt_q.use_shader_pack8 = false;
              opt_q.use_subgroup_ops = false;
              opt_q.use_reserved_0 = false;
              opt_q.num_threads = 0;
              opt_q.blob_allocator = (Allocator *)0x0;
              opt_q.workspace_allocator = (Allocator *)0x0;
              for (lVar43 = 0; lVar43 < (this->super_ConvolutionDepthWise).group;
                  lVar43 = lVar43 + 1) {
                fVar150 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                           weight_data_int8_scales.data + lVar43 * 4);
                fVar151 = 0.0;
                if (fVar150 != 0.0) {
                  fVar151 = 1.0 / (fVar150 *
                                  *(float *)((long)(this->super_ConvolutionDepthWise).
                                                   bottom_blob_int8_scales.data + lVar43 * 4));
                }
                _top_rescale = (void *)CONCAT44(iStack_224,fVar151);
                _scale_out = (void *)CONCAT44(uStack_1ac,
                                              *(undefined4 *)
                                               ((long)(this->super_ConvolutionDepthWise).
                                                      top_blob_int8_scales.data + lVar43 * 4));
                std::vector<float,_std::allocator<float>_>::push_back
                          ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
                std::vector<float,_std::allocator<float>_>::push_back
                          ((vector<float,_std::allocator<float>_> *)&opt_q,&scale_out);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)&local_c0,
                         (vector<float,_std::allocator<float>_> *)&opt_q);
              lVar43 = (long)local_2c8.w;
              iVar36 = top_blob->w;
              local_1d8._0_4_ = top_blob->h;
              pvVar10 = (this->super_ConvolutionDepthWise).bias_data.data;
              pvVar11 = (this->weight_data_tm).data;
              local_280 = lVar43 * 2;
              uVar56 = 0;
              if ((int)local_1d8._0_4_ < 1) {
                local_1d8._0_4_ = 0;
              }
              lVar45 = (long)((local_2c8.w - iVar36) * 2);
              uVar60 = (ulong)(uint)top_blob->c;
              if (top_blob->c < 1) {
                uVar60 = uVar56;
              }
              for (; uVar56 != uVar60; uVar56 = uVar56 + 1) {
                if (pvVar10 == (void *)0x0) {
                  fVar150 = 0.0;
                }
                else {
                  fVar150 = *(float *)((long)pvVar10 + uVar56 * 4);
                }
                puVar55 = (undefined1 *)
                          (top_blob->cstep * uVar56 * top_blob->elemsize + (long)top_blob->data);
                fVar151 = local_c0._M_impl.super__Vector_impl_data._M_start[uVar56 * 2];
                fVar152 = local_c0._M_impl.super__Vector_impl_data._M_start[uVar56 * 2 + 1];
                local_330 = (undefined4 *)
                            (local_2c8.cstep * uVar56 *
                             CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize) +
                            (long)local_2c8.data);
                lVar48 = uVar56 * 9;
                local_338 = (void *)(lVar43 + (long)local_330);
                lVar38 = (long)local_330 + local_280;
                for (iVar40 = 0; iVar40 != local_1d8._0_4_; iVar40 = iVar40 + 1) {
                  lVar58 = 0;
                  for (iVar39 = iVar36; 0 < iVar39; iVar39 = iVar39 + -1) {
                    fVar153 = roundf(((float)((int)*(char *)((long)pvVar11 + lVar48 + 8) *
                                              (int)*(char *)(lVar38 + 2 + lVar58) +
                                              (int)*(char *)((long)pvVar11 + lVar48 + 7) *
                                              (int)*(char *)(lVar38 + 1 + lVar58) +
                                             (int)*(char *)((long)pvVar11 + lVar48 + 6) *
                                             (int)*(char *)(lVar38 + lVar58) +
                                             (int)*(char *)((long)pvVar11 + lVar48 + 5) *
                                             (int)*(char *)((long)local_338 + 2 + lVar58) +
                                             (int)*(char *)((long)pvVar11 + lVar48 + 4) *
                                             (int)*(char *)((long)local_338 + 1 + lVar58) +
                                             (int)*(char *)((long)pvVar11 + lVar48 + 3) *
                                             (int)*(char *)((long)local_338 + lVar58) +
                                             (int)*(char *)((long)pvVar11 + lVar48 + 2) *
                                             (int)*(char *)((long)local_330 + lVar58 + 2) +
                                             (int)*(char *)((long)pvVar11 + lVar48 + 1) *
                                             (int)*(char *)((long)local_330 + lVar58 + 1) +
                                             (int)*(char *)((long)pvVar11 + lVar48) *
                                             (int)*(char *)((long)local_330 + lVar58)) * fVar151 +
                                     fVar150) * fVar152);
                    iVar50 = (int)fVar153;
                    if (iVar50 < -0x7e) {
                      iVar50 = -0x7f;
                    }
                    if (0x7e < iVar50) {
                      iVar50 = 0x7f;
                    }
                    *puVar55 = (char)iVar50;
                    puVar55 = puVar55 + 1;
                    lVar58 = lVar58 + 2;
                  }
                  local_330 = (undefined4 *)((long)local_330 + lVar58 + lVar45);
                  local_338 = (void *)((long)local_338 + lVar45 + lVar58);
                  lVar38 = lVar38 + lVar45 + lVar58;
                }
              }
              this_00 = &local_c0;
            }
          }
          else if (iVar49 < 0x65) {
            opt_q.workspace_allocator = (Allocator *)0x0;
            opt_q.lightmode = false;
            opt_q.use_shader_pack8 = false;
            opt_q.use_subgroup_ops = false;
            opt_q.use_reserved_0 = false;
            opt_q.num_threads = 0;
            opt_q.blob_allocator = (Allocator *)0x0;
            lVar43 = 0;
            while( true ) {
              if ((this->super_ConvolutionDepthWise).group <= lVar43) break;
              _top_rescale = (void *)CONCAT44(iStack_224,
                                              1.0 / (*(float *)((long)(this->
                                                  super_ConvolutionDepthWise).
                                                  weight_data_int8_scales.data + lVar43 * 4) *
                                                  *(float *)((long)(this->super_ConvolutionDepthWise
                                                                   ).bottom_blob_int8_scales.data +
                                                            lVar43 * 4)));
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
              lVar43 = lVar43 + 1;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_a8,
                       (vector<float,_std::allocator<float>_> *)&opt_q);
            iVar36 = top_blob->w;
            iVar40 = top_blob->h;
            pvVar10 = (this->super_ConvolutionDepthWise).bias_data.data;
            pvVar11 = (this->weight_data_tm).data;
            local_1d8._0_4_ = top_blob->d;
            pvVar12 = top_blob->data;
            uVar56 = top_blob->elemsize;
            lVar45 = top_blob->cstep * uVar56;
            lVar43 = (long)iVar40 * (long)iVar36;
            iVar39 = 0;
            if (0 < iVar40) {
              iVar39 = iVar40;
            }
            iVar40 = top_blob->dims;
            local_280 = CONCAT44(local_280._4_4_,iVar40);
            uVar60 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar60 = 0;
            }
            local_1b8 = (undefined4 *)local_2c8.data;
            local_1c0 = (long)local_2c8.w * 2;
            local_1c8 = local_a8._M_impl.super__Vector_impl_data._M_start;
            pvVar51 = pvVar12;
            for (uVar44 = 0; uVar44 != uVar60; uVar44 = uVar44 + 1) {
              iVar50 = (int)((uVar56 * lVar43 + 0xf & 0xfffffffffffffff0) / uVar56);
              if (iVar40 == 4) {
                iVar50 = (int)lVar43;
              }
              if (pvVar10 == (void *)0x0) {
                uVar62 = 0;
              }
              else {
                uVar62 = *(undefined4 *)((long)pvVar10 + uVar44 * 4);
              }
              fVar150 = local_a8._M_impl.super__Vector_impl_data._M_start[uVar44];
              iVar50 = iVar50 * local_1d8._0_4_;
              if (iVar50 < 1) {
                iVar50 = 0;
              }
              for (lVar38 = 0; iVar50 != (int)lVar38; lVar38 = lVar38 + 1) {
                *(undefined4 *)((long)pvVar51 + lVar38 * 4) = uVar62;
              }
              lVar58 = uVar44 * 9;
              puVar37 = (undefined4 *)
                        (CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize) *
                         local_2c8.cstep * uVar44 + (long)local_2c8.data);
              lVar38 = (long)local_2c8.w + (long)puVar37;
              lVar48 = local_1c0 + (long)puVar37;
              pvVar33 = (void *)(lVar45 * uVar44 + (long)pvVar12);
              for (iVar50 = 0; iVar50 != iVar39; iVar50 = iVar50 + 1) {
                lVar32 = 0;
                pvVar57 = pvVar33;
                for (iVar53 = iVar36; 0 < iVar53; iVar53 = iVar53 + -1) {
                  *(float *)((long)pvVar33 + lVar32 * 4) =
                       (float)((int)*(char *)((long)pvVar11 + lVar58 + 8) *
                               (int)*(char *)(lVar48 + 2 + lVar32) +
                               (int)*(char *)((long)pvVar11 + lVar58 + 7) *
                               (int)*(char *)(lVar48 + 1 + lVar32) +
                              (int)*(char *)((long)pvVar11 + lVar58 + 6) *
                              (int)*(char *)(lVar48 + lVar32) +
                              (int)*(char *)((long)pvVar11 + lVar58 + 5) *
                              (int)*(char *)(lVar38 + 2 + lVar32) +
                              (int)*(char *)((long)pvVar11 + lVar58 + 4) *
                              (int)*(char *)(lVar38 + 1 + lVar32) +
                              (int)*(char *)((long)pvVar11 + lVar58 + 3) *
                              (int)*(char *)(lVar38 + lVar32) +
                              (int)*(char *)((long)pvVar11 + lVar58 + 2) *
                              (int)*(char *)((long)puVar37 + lVar32 + 2) +
                              (int)*(char *)((long)pvVar11 + lVar58 + 1) *
                              (int)*(char *)((long)puVar37 + lVar32 + 1) +
                              (int)*(char *)((long)pvVar11 + lVar58) *
                              (int)*(char *)((long)puVar37 + lVar32)) * fVar150 +
                       *(float *)((long)pvVar33 + lVar32 * 4);
                  pvVar57 = (void *)((long)pvVar57 + 4);
                  lVar32 = lVar32 + 1;
                }
                puVar37 = (undefined4 *)((long)puVar37 + lVar32 + 2);
                lVar38 = lVar38 + lVar32 + 2;
                lVar48 = lVar48 + lVar32 + 2;
                pvVar33 = pvVar57;
              }
              pvVar51 = (void *)((long)pvVar51 + lVar45);
            }
            this_00 = &local_a8;
          }
          else {
            opt_q.lightmode = false;
            opt_q.use_shader_pack8 = false;
            opt_q.use_subgroup_ops = false;
            opt_q.use_reserved_0 = false;
            opt_q.num_threads = 0;
            opt_q.blob_allocator = (Allocator *)0x0;
            opt_q.workspace_allocator = (Allocator *)0x0;
            for (lVar43 = 0; lVar43 < (this->super_ConvolutionDepthWise).group; lVar43 = lVar43 + 1)
            {
              fVar150 = *(float *)((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales.
                                         data + lVar43 * 4);
              fVar151 = 0.0;
              if (fVar150 != 0.0) {
                fVar151 = 1.0 / (fVar150 *
                                *(float *)((long)(this->super_ConvolutionDepthWise).
                                                 bottom_blob_int8_scales.data + lVar43 * 4));
              }
              _top_rescale = (void *)CONCAT44(iStack_224,fVar151);
              _scale_out = (void *)CONCAT44(uStack_1ac,
                                            *(undefined4 *)
                                             ((long)(this->super_ConvolutionDepthWise).
                                                    top_blob_int8_scales.data + lVar43 * 4));
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&scale_out);
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_90,
                       (vector<float,_std::allocator<float>_> *)&opt_q);
            lVar43 = (long)local_2c8.w;
            iVar36 = top_blob->w;
            local_1d8._0_4_ = top_blob->h;
            pvVar10 = (this->super_ConvolutionDepthWise).bias_data.data;
            pvVar11 = (this->weight_data_tm).data;
            uVar56 = 0;
            if ((int)local_1d8._0_4_ < 1) {
              local_1d8._0_4_ = 0;
            }
            uVar60 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar60 = uVar56;
            }
            for (; uVar56 != uVar60; uVar56 = uVar56 + 1) {
              if (pvVar10 == (void *)0x0) {
                fVar150 = 0.0;
              }
              else {
                fVar150 = *(float *)((long)pvVar10 + uVar56 * 4);
              }
              local_338 = (void *)(top_blob->cstep * uVar56 * top_blob->elemsize +
                                  (long)top_blob->data);
              fVar151 = local_90._M_impl.super__Vector_impl_data._M_start[uVar56 * 2];
              fVar152 = local_90._M_impl.super__Vector_impl_data._M_start[uVar56 * 2 + 1];
              local_330 = (undefined4 *)
                          (local_2c8.cstep * uVar56 *
                           CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize) +
                          (long)local_2c8.data);
              lVar48 = uVar56 * 9;
              lVar45 = (long)local_330 + lVar43;
              lVar38 = (long)local_330 + lVar43 * 2;
              for (iVar40 = 0; iVar40 != local_1d8._0_4_; iVar40 = iVar40 + 1) {
                lVar58 = 0;
                for (iVar39 = iVar36; 0 < iVar39; iVar39 = iVar39 + -1) {
                  fVar153 = roundf(((float)((int)*(char *)((long)pvVar11 + lVar48 + 8) *
                                            (int)*(char *)(lVar38 + 2 + lVar58) +
                                            (int)*(char *)((long)pvVar11 + lVar48 + 7) *
                                            (int)*(char *)(lVar38 + 1 + lVar58) +
                                           (int)*(char *)((long)pvVar11 + lVar48 + 6) *
                                           (int)*(char *)(lVar38 + lVar58) +
                                           (int)*(char *)((long)pvVar11 + lVar48 + 5) *
                                           (int)*(char *)(lVar45 + 2 + lVar58) +
                                           (int)*(char *)((long)pvVar11 + lVar48 + 4) *
                                           (int)*(char *)(lVar45 + 1 + lVar58) +
                                           (int)*(char *)((long)pvVar11 + lVar48 + 3) *
                                           (int)*(char *)(lVar45 + lVar58) +
                                           (int)*(char *)((long)pvVar11 + lVar48 + 2) *
                                           (int)*(char *)((long)local_330 + lVar58 + 2) +
                                           (int)*(char *)((long)pvVar11 + lVar48 + 1) *
                                           (int)*(char *)((long)local_330 + lVar58 + 1) +
                                           (int)*(char *)((long)pvVar11 + lVar48) *
                                           (int)*(char *)((long)local_330 + lVar58)) * fVar151 +
                                   fVar150) * fVar152);
                  iVar50 = (int)fVar153;
                  if (iVar50 < -0x7e) {
                    iVar50 = -0x7f;
                  }
                  if (0x7e < iVar50) {
                    iVar50 = 0x7f;
                  }
                  *(char *)((long)local_338 + lVar58) = (char)iVar50;
                  lVar58 = lVar58 + 1;
                }
                local_330 = (undefined4 *)((long)local_330 + lVar58 + 2);
                lVar45 = lVar45 + lVar58 + 2;
                lVar38 = lVar38 + lVar58 + 2;
                local_338 = (void *)((long)local_338 + lVar58);
              }
            }
            this_00 = &local_90;
          }
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(this_00);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    ((_Vector_base<float,_std::allocator<float>_> *)&opt_q);
          pLVar14 = this->activation;
          if (pLVar14 != (Layer *)0x0) {
            (*pLVar14->_vptr_Layer[9])(pLVar14,top_blob,opt);
          }
        }
        else if (iVar53 == 8) {
          uVar56 = (long)(this->super_ConvolutionDepthWise).kernel_h *
                   (long)(this->super_ConvolutionDepthWise).kernel_w;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&opt_q,uVar56,
                     (allocator_type *)&top_rescale);
          iVar40 = (this->super_ConvolutionDepthWise).dilation_h;
          iVar50 = (this->super_ConvolutionDepthWise).kernel_w;
          iVar42 = (this->super_ConvolutionDepthWise).dilation_w * iVar50;
          iVar41 = 0;
          lVar43 = 0;
          for (iVar53 = 0; auVar63 = _DAT_00537820,
              iVar53 < (this->super_ConvolutionDepthWise).kernel_h; iVar53 = iVar53 + 1) {
            for (lVar45 = 0; (int)lVar45 < iVar50; lVar45 = lVar45 + 1) {
              *(int *)(opt_q._0_8_ + (long)(int)lVar43 * 4 + lVar45 * 4) = iVar41;
              iVar41 = iVar41 + (this->super_ConvolutionDepthWise).dilation_w;
              iVar50 = (this->super_ConvolutionDepthWise).kernel_w;
            }
            iVar41 = iVar41 + (iVar73 * iVar40 - iVar42);
            lVar43 = (int)lVar43 + lVar45;
          }
          iVar40 = 0;
          uVar60 = uVar56 & 0xffffffff;
          if ((int)uVar56 < 1) {
            uVar60 = 0;
          }
          if ((int)uVar54 < 1) {
            uVar54 = 0;
          }
          fVar150 = (float)DAT_00537820;
          fVar151 = DAT_00537820._4_4_;
          fVar152 = DAT_00537820._8_4_;
          fVar153 = DAT_00537820._12_4_;
          for (uVar44 = 0; uVar44 != uVar54; uVar44 = uVar44 + 1) {
            pauVar46 = (undefined1 (*) [16])
                       (top_blob->elemsize * uVar44 * top_blob->cstep + (long)top_blob->data);
            pvVar10 = (this->weight_data_tm).data;
            pauVar47 = pauVar46;
            for (iVar50 = 0; iVar50 <= iVar36; iVar50 = iVar50 + 1) {
              for (iVar42 = 0; auVar69 = ZEXT816(0), iVar42 <= iVar39; iVar42 = iVar42 + 1) {
                iVar53 = 0;
                iVar73 = 0;
                iVar41 = 0;
                iVar80 = 0;
                iVar84 = 0;
                iVar93 = 0;
                iVar95 = 0;
                iVar97 = 0;
                for (uVar52 = 0; uVar60 != uVar52; uVar52 = uVar52 + 1) {
                  uVar5 = *(ulong *)((long)local_2c8.data +
                                    (long)*(int *)(opt_q._0_8_ + uVar52 * 4) * 8 +
                                    (long)iVar50 * (long)(this->super_ConvolutionDepthWise).stride_h
                                    * (long)local_2c8.w *
                                      CONCAT44(local_2c8.elemsize._4_4_,
                                               (undefined4)local_2c8.elemsize) +
                                    (long)((this->super_ConvolutionDepthWise).stride_w * iVar42 * 8)
                                    + local_2c8.cstep * uVar44 *
                                      CONCAT44(local_2c8.elemsize._4_4_,
                                               (undefined4)local_2c8.elemsize));
                  cVar115 = (char)(uVar5 >> 8);
                  cVar116 = (char)(uVar5 >> 0x10);
                  cVar117 = (char)(uVar5 >> 0x18);
                  cVar118 = (char)(uVar5 >> 0x20);
                  cVar119 = (char)(uVar5 >> 0x28);
                  cVar120 = (char)(uVar5 >> 0x30);
                  auVar106._8_6_ = 0;
                  auVar106._0_8_ = uVar5;
                  auVar106[0xe] = (char)(uVar5 >> 0x38);
                  auVar106[0xf] = -((long)uVar5 < 0);
                  auVar105._14_2_ = auVar106._14_2_;
                  auVar105._8_5_ = 0;
                  auVar105._0_8_ = uVar5;
                  auVar105[0xd] = -(cVar120 < '\0');
                  auVar104._13_3_ = auVar105._13_3_;
                  auVar104._8_4_ = 0;
                  auVar104._0_8_ = uVar5;
                  auVar104[0xc] = cVar120;
                  auVar103._12_4_ = auVar104._12_4_;
                  auVar103._8_3_ = 0;
                  auVar103._0_8_ = uVar5;
                  auVar103[0xb] = -(cVar119 < '\0');
                  auVar102._11_5_ = auVar103._11_5_;
                  auVar102._8_2_ = 0;
                  auVar102._0_8_ = uVar5;
                  auVar102[10] = cVar119;
                  auVar101._10_6_ = auVar102._10_6_;
                  auVar101[8] = 0;
                  auVar101._0_8_ = uVar5;
                  auVar101[9] = -(cVar118 < '\0');
                  auVar100._9_7_ = auVar101._9_7_;
                  auVar100[8] = cVar118;
                  auVar100._0_8_ = uVar5;
                  Var23 = CONCAT91(CONCAT81(auVar100._8_8_,-(cVar117 < '\0')),cVar117);
                  auVar22._2_10_ = Var23;
                  auVar22[1] = -(cVar116 < '\0');
                  auVar22[0] = cVar116;
                  auVar21._2_12_ = auVar22;
                  auVar21[1] = -(cVar115 < '\0');
                  auVar21[0] = cVar115;
                  auVar99._0_2_ = CONCAT11(-((char)uVar5 < '\0'),(char)uVar5);
                  auVar99._2_14_ = auVar21;
                  uVar5 = *(ulong *)((long)pvVar10 + uVar52 * 8 + (long)iVar40);
                  cVar115 = (char)(uVar5 >> 8);
                  cVar116 = (char)(uVar5 >> 0x10);
                  cVar117 = (char)(uVar5 >> 0x18);
                  cVar118 = (char)(uVar5 >> 0x20);
                  cVar119 = (char)(uVar5 >> 0x28);
                  cVar120 = (char)(uVar5 >> 0x30);
                  auVar129._8_6_ = 0;
                  auVar129._0_8_ = uVar5;
                  auVar129[0xe] = (char)(uVar5 >> 0x38);
                  auVar129[0xf] = -((long)uVar5 < 0);
                  auVar128._14_2_ = auVar129._14_2_;
                  auVar128._8_5_ = 0;
                  auVar128._0_8_ = uVar5;
                  auVar128[0xd] = -(cVar120 < '\0');
                  auVar127._13_3_ = auVar128._13_3_;
                  auVar127._8_4_ = 0;
                  auVar127._0_8_ = uVar5;
                  auVar127[0xc] = cVar120;
                  auVar126._12_4_ = auVar127._12_4_;
                  auVar126._8_3_ = 0;
                  auVar126._0_8_ = uVar5;
                  auVar126[0xb] = -(cVar119 < '\0');
                  auVar125._11_5_ = auVar126._11_5_;
                  auVar125._8_2_ = 0;
                  auVar125._0_8_ = uVar5;
                  auVar125[10] = cVar119;
                  auVar124._10_6_ = auVar125._10_6_;
                  auVar124[8] = 0;
                  auVar124._0_8_ = uVar5;
                  auVar124[9] = -(cVar118 < '\0');
                  auVar123._9_7_ = auVar124._9_7_;
                  auVar123[8] = cVar118;
                  auVar123._0_8_ = uVar5;
                  Var26 = CONCAT91(CONCAT81(auVar123._8_8_,-(cVar117 < '\0')),cVar117);
                  auVar25._2_10_ = Var26;
                  auVar25[1] = -(cVar116 < '\0');
                  auVar25[0] = cVar116;
                  auVar24._2_12_ = auVar25;
                  auVar24[1] = -(cVar115 < '\0');
                  auVar24[0] = cVar115;
                  auVar122._0_2_ = CONCAT11(-((char)uVar5 < '\0'),(char)uVar5);
                  auVar122._2_14_ = auVar24;
                  sVar143 = (short)Var26 * (short)Var23;
                  auVar130 = pmulhw(auVar122,auVar99);
                  iVar28 = CONCAT22(auVar130._6_2_,sVar143);
                  Var23 = CONCAT64(CONCAT42(iVar28,auVar130._4_2_),
                                   CONCAT22(auVar25._0_2_ * auVar22._0_2_,sVar143));
                  auVar27._4_8_ = (long)((unkuint10)Var23 >> 0x10);
                  auVar27._2_2_ = auVar130._2_2_;
                  auVar27._0_2_ = auVar24._0_2_ * auVar21._0_2_;
                  iVar139 = CONCAT22(auVar130._8_2_,auVar123._8_2_ * auVar100._8_2_);
                  auVar140._0_8_ =
                       CONCAT26(auVar130._10_2_,CONCAT24(auVar125._10_2_ * auVar102._10_2_,iVar139))
                  ;
                  auVar140._8_2_ = auVar127._12_2_ * auVar104._12_2_;
                  auVar140._10_2_ = auVar130._12_2_;
                  auVar141._12_2_ = auVar128._14_2_ * auVar105._14_2_;
                  auVar141._0_12_ = auVar140;
                  auVar141._14_2_ = auVar130._14_2_;
                  iVar84 = iVar84 + CONCAT22(auVar130._0_2_,auVar122._0_2_ * auVar99._0_2_);
                  iVar93 = iVar93 + auVar27._0_4_;
                  iVar95 = iVar95 + (int)((unkuint10)Var23 >> 0x10);
                  iVar97 = iVar97 + iVar28;
                  iVar53 = iVar53 + iVar139;
                  iVar73 = iVar73 + (int)((ulong)auVar140._0_8_ >> 0x20);
                  iVar41 = iVar41 + auVar140._8_4_;
                  iVar80 = iVar80 + auVar141._12_4_;
                }
                pvVar11 = (this->super_ConvolutionDepthWise).weight_data_int8_scales.data;
                pvVar12 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
                pfVar34 = (float *)((long)pvVar12 + uVar44 * 0x20);
                pfVar2 = (float *)((long)pvVar12 + uVar44 * 0x20 + 0x10);
                pfVar1 = (float *)((long)pvVar11 + uVar44 * 0x20);
                pfVar3 = (float *)((long)pvVar11 + uVar44 * 0x20 + 0x10);
                auVar107._0_4_ = *pfVar34 * *pfVar1;
                auVar107._4_4_ = pfVar34[1] * pfVar1[1];
                auVar107._8_4_ = pfVar34[2] * pfVar1[2];
                auVar107._12_4_ = pfVar34[3] * pfVar1[3];
                auVar130 = rcpps(auVar107,auVar107);
                auVar131._0_4_ = *pfVar2 * *pfVar3;
                auVar131._4_4_ = pfVar2[1] * pfVar3[1];
                auVar131._8_4_ = pfVar2[2] * pfVar3[2];
                auVar131._12_4_ = pfVar2[3] * pfVar3[3];
                auVar132 = rcpps(auVar131,auVar131);
                auVar86._0_4_ = (float)iVar84 * (float)(-(uint)(*pfVar1 != 0.0) & auVar130._0_4_);
                auVar86._4_4_ = (float)iVar93 * (float)(-(uint)(pfVar1[1] != 0.0) & auVar130._4_4_);
                auVar86._8_4_ = (float)iVar95 * (float)(-(uint)(pfVar1[2] != 0.0) & auVar130._8_4_);
                auVar86._12_4_ =
                     (float)iVar97 * (float)(-(uint)(pfVar1[3] != 0.0) & auVar130._12_4_);
                auVar66._0_4_ = (float)iVar53 * (float)(-(uint)(*pfVar3 != 0.0) & auVar132._0_4_);
                auVar66._4_4_ = (float)iVar73 * (float)(-(uint)(pfVar3[1] != 0.0) & auVar132._4_4_);
                auVar66._8_4_ = (float)iVar41 * (float)(-(uint)(pfVar3[2] != 0.0) & auVar132._8_4_);
                auVar66._12_4_ =
                     (float)iVar80 * (float)(-(uint)(pfVar3[3] != 0.0) & auVar132._12_4_);
                if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                  pvVar11 = (this->super_ConvolutionDepthWise).bias_data.data;
                  pfVar34 = (float *)((long)pvVar11 + uVar44 * 0x20);
                  auVar130 = *(undefined1 (*) [16])((long)pvVar11 + uVar44 * 0x20 + 0x10);
                  auVar86._0_4_ = auVar86._0_4_ + *pfVar34;
                  auVar86._4_4_ = auVar86._4_4_ + pfVar34[1];
                  auVar86._8_4_ = auVar86._8_4_ + pfVar34[2];
                  auVar86._12_4_ = auVar86._12_4_ + pfVar34[3];
                  auVar66._0_4_ = auVar66._0_4_ + auVar130._0_4_;
                  auVar66._4_4_ = auVar66._4_4_ + auVar130._4_4_;
                  auVar66._8_4_ = auVar66._8_4_ + auVar130._8_4_;
                  auVar66._12_4_ = auVar66._12_4_ + auVar130._12_4_;
                }
                iVar53 = (this->super_ConvolutionDepthWise).activation_type;
                auVar108 = auVar66;
                auVar146 = auVar86;
                if (5 < iVar53 - 1U) goto switchD_0039b501_caseD_1;
                fVar77 = auVar86._0_4_;
                fVar81 = auVar86._4_4_;
                fVar85 = auVar86._8_4_;
                fVar94 = auVar86._12_4_;
                auVar146 = maxps(auVar86,auVar69);
                fVar65 = auVar66._8_4_;
                fVar74 = auVar66._12_4_;
                auVar108 = maxps(auVar66,auVar69);
                switch(iVar53) {
                case 2:
                  auVar130 = minps(auVar86,auVar69);
                  fVar65 = *(this->super_ConvolutionDepthWise).activation_params.data;
                  auVar147._0_4_ = auVar146._0_4_ + auVar130._0_4_ * fVar65;
                  auVar147._4_4_ = auVar146._4_4_ + auVar130._4_4_ * fVar65;
                  auVar147._8_4_ = auVar146._8_4_ + auVar130._8_4_ * fVar65;
                  auVar147._12_4_ = auVar146._12_4_ + auVar130._12_4_ * fVar65;
                  auVar69 = minps(auVar66,auVar69);
                  auVar109._0_4_ = auVar108._0_4_ + auVar69._0_4_ * fVar65;
                  auVar109._4_4_ = auVar108._4_4_ + auVar69._4_4_ * fVar65;
                  auVar109._8_4_ = auVar108._8_4_ + auVar69._8_4_ * fVar65;
                  auVar109._12_4_ = auVar108._12_4_ + auVar69._12_4_ * fVar65;
                  auVar108 = auVar109;
                  auVar146 = auVar147;
                  break;
                case 3:
                  puVar37 = (undefined4 *)(this->super_ConvolutionDepthWise).activation_params.data;
                  uVar62 = *puVar37;
                  uVar4 = puVar37[1];
                  auVar112._4_4_ = uVar62;
                  auVar112._0_4_ = uVar62;
                  auVar112._8_4_ = uVar62;
                  auVar112._12_4_ = uVar62;
                  auVar134._4_4_ = uVar4;
                  auVar134._0_4_ = uVar4;
                  auVar134._8_4_ = uVar4;
                  auVar134._12_4_ = uVar4;
                  auVar69 = maxps(auVar86,auVar112);
                  auVar146 = minps(auVar69,auVar134);
                  auVar69 = maxps(auVar66,auVar112);
                  auVar108 = minps(auVar69,auVar134);
                  break;
                case 4:
                  auVar90._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
                  auVar90._8_4_ = -fVar85;
                  auVar90._12_4_ = -fVar94;
                  auVar69 = minps(auVar90,_DAT_005377e0);
                  auVar69 = maxps(auVar69,_DAT_005377f0);
                  fVar77 = auVar69._0_4_ * 1.442695 + 0.5;
                  fVar81 = auVar69._4_4_ * 1.442695 + 0.5;
                  fVar85 = auVar69._8_4_ * 1.442695 + 0.5;
                  fVar94 = auVar69._12_4_ * 1.442695 + 0.5;
                  fVar96 = (float)(int)fVar77;
                  fVar98 = (float)(int)fVar81;
                  fVar144 = (float)(int)fVar85;
                  fVar145 = (float)(int)fVar94;
                  fVar96 = fVar96 - (float)(-(uint)(fVar77 < fVar96) & (uint)fVar150);
                  fVar98 = fVar98 - (float)(-(uint)(fVar81 < fVar98) & (uint)fVar151);
                  fVar144 = fVar144 - (float)(-(uint)(fVar85 < fVar144) & (uint)fVar152);
                  fVar145 = fVar145 - (float)(-(uint)(fVar94 < fVar145) & (uint)fVar153);
                  fVar77 = auVar69._0_4_ - fVar96 * 0.6931472;
                  fVar81 = auVar69._4_4_ - fVar98 * 0.6931472;
                  fVar85 = auVar69._8_4_ - fVar144 * 0.6931472;
                  fVar94 = auVar69._12_4_ - fVar145 * 0.6931472;
                  auVar135._0_4_ =
                       (float)((int)fVar96 * 0x800000 + (int)fVar150) *
                       (fVar77 + fVar150 +
                       (((((fVar77 * 0.00019875691 + 0.0013981999) * fVar77 + 0.008333452) * fVar77
                         + 0.041665796) * fVar77 + 0.16666666) * fVar77 + 0.5) * fVar77 * fVar77) +
                       fVar150;
                  auVar135._4_4_ =
                       (float)((int)fVar98 * 0x800000 + (int)fVar151) *
                       (fVar81 + fVar151 +
                       (((((fVar81 * 0.00019875691 + 0.0013981999) * fVar81 + 0.008333452) * fVar81
                         + 0.041665796) * fVar81 + 0.16666666) * fVar81 + 0.5) * fVar81 * fVar81) +
                       fVar151;
                  auVar135._8_4_ =
                       (float)((int)fVar144 * 0x800000 + (int)fVar152) *
                       (fVar85 + fVar152 +
                       (((((fVar85 * 0.00019875691 + 0.0013981999) * fVar85 + 0.008333452) * fVar85
                         + 0.041665796) * fVar85 + 0.16666666) * fVar85 + 0.5) * fVar85 * fVar85) +
                       fVar152;
                  auVar135._12_4_ =
                       (float)((int)fVar145 * 0x800000 + (int)fVar153) *
                       (fVar94 + fVar153 +
                       (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) * fVar94
                         + 0.041665796) * fVar94 + 0.16666666) * fVar94 + 0.5) * fVar94 * fVar94) +
                       fVar153;
                  auVar146 = divps(auVar63,auVar135);
                  auVar67._0_8_ = auVar66._0_8_ ^ 0x8000000080000000;
                  auVar67._8_4_ = -fVar65;
                  auVar67._12_4_ = -fVar74;
                  auVar69 = minps(auVar67,_DAT_005377e0);
                  auVar69 = maxps(auVar69,_DAT_005377f0);
                  fVar65 = auVar69._0_4_ * 1.442695 + 0.5;
                  fVar74 = auVar69._4_4_ * 1.442695 + 0.5;
                  fVar77 = auVar69._8_4_ * 1.442695 + 0.5;
                  fVar81 = auVar69._12_4_ * 1.442695 + 0.5;
                  fVar85 = (float)(int)fVar65;
                  fVar94 = (float)(int)fVar74;
                  fVar96 = (float)(int)fVar77;
                  fVar98 = (float)(int)fVar81;
                  fVar85 = fVar85 - (float)(-(uint)(fVar65 < fVar85) & (uint)fVar150);
                  fVar94 = fVar94 - (float)(-(uint)(fVar74 < fVar94) & (uint)fVar151);
                  fVar96 = fVar96 - (float)(-(uint)(fVar77 < fVar96) & (uint)fVar152);
                  fVar98 = fVar98 - (float)(-(uint)(fVar81 < fVar98) & (uint)fVar153);
                  fVar65 = auVar69._0_4_ - fVar85 * 0.6931472;
                  fVar74 = auVar69._4_4_ - fVar94 * 0.6931472;
                  fVar77 = auVar69._8_4_ - fVar96 * 0.6931472;
                  fVar81 = auVar69._12_4_ - fVar98 * 0.6931472;
                  auVar91._0_4_ =
                       (float)((int)fVar85 * 0x800000 + (int)fVar150) *
                       (fVar65 + fVar150 +
                       (((((fVar65 * 0.00019875691 + 0.0013981999) * fVar65 + 0.008333452) * fVar65
                         + 0.041665796) * fVar65 + 0.16666666) * fVar65 + 0.5) * fVar65 * fVar65) +
                       fVar150;
                  auVar91._4_4_ =
                       (float)((int)fVar94 * 0x800000 + (int)fVar151) *
                       (fVar74 + fVar151 +
                       (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74
                         + 0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5) * fVar74 * fVar74) +
                       fVar151;
                  auVar91._8_4_ =
                       (float)((int)fVar96 * 0x800000 + (int)fVar152) *
                       (fVar77 + fVar152 +
                       (((((fVar77 * 0.00019875691 + 0.0013981999) * fVar77 + 0.008333452) * fVar77
                         + 0.041665796) * fVar77 + 0.16666666) * fVar77 + 0.5) * fVar77 * fVar77) +
                       fVar152;
                  auVar91._12_4_ =
                       (float)((int)fVar98 * 0x800000 + (int)fVar153) *
                       (fVar81 + fVar153 +
                       (((((fVar81 * 0.00019875691 + 0.0013981999) * fVar81 + 0.008333452) * fVar81
                         + 0.041665796) * fVar81 + 0.16666666) * fVar81 + 0.5) * fVar81 * fVar81) +
                       fVar153;
                  auVar108 = divps(auVar63,auVar91);
                  break;
                case 5:
                  auVar69 = minps(auVar86,_DAT_005377e0);
                  auVar69 = maxps(auVar69,_DAT_005377f0);
                  fVar96 = auVar69._0_4_ * 1.442695 + 0.5;
                  fVar98 = auVar69._4_4_ * 1.442695 + 0.5;
                  fVar144 = auVar69._8_4_ * 1.442695 + 0.5;
                  fVar145 = auVar69._12_4_ * 1.442695 + 0.5;
                  fVar121 = (float)(int)fVar96;
                  fVar136 = (float)(int)fVar98;
                  fVar137 = (float)(int)fVar144;
                  fVar138 = (float)(int)fVar145;
                  fVar121 = fVar121 - (float)(-(uint)(fVar96 < fVar121) & (uint)fVar150);
                  fVar136 = fVar136 - (float)(-(uint)(fVar98 < fVar136) & (uint)fVar151);
                  fVar137 = fVar137 - (float)(-(uint)(fVar144 < fVar137) & (uint)fVar152);
                  fVar138 = fVar138 - (float)(-(uint)(fVar145 < fVar138) & (uint)fVar153);
                  fVar96 = auVar69._0_4_ - fVar121 * 0.6931472;
                  fVar98 = auVar69._4_4_ - fVar136 * 0.6931472;
                  fVar144 = auVar69._8_4_ - fVar137 * 0.6931472;
                  fVar145 = auVar69._12_4_ - fVar138 * 0.6931472;
                  auVar148._0_4_ =
                       (float)((int)fVar121 * 0x800000 + (int)fVar150) *
                       (fVar96 + fVar150 +
                       (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) * fVar96
                         + 0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5) * fVar96 * fVar96) +
                       fVar150;
                  auVar148._4_4_ =
                       (float)((int)fVar136 * 0x800000 + (int)fVar151) *
                       (fVar98 + fVar151 +
                       (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) * fVar98
                         + 0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5) * fVar98 * fVar98) +
                       fVar151;
                  auVar148._8_4_ =
                       (float)((int)fVar137 * 0x800000 + (int)fVar152) *
                       (fVar144 + fVar152 +
                       (((((fVar144 * 0.00019875691 + 0.0013981999) * fVar144 + 0.008333452) *
                          fVar144 + 0.041665796) * fVar144 + 0.16666666) * fVar144 + 0.5) *
                       fVar144 * fVar144) + fVar152;
                  auVar148._12_4_ =
                       (float)((int)fVar138 * 0x800000 + (int)fVar153) *
                       (fVar145 + fVar153 +
                       (((((fVar145 * 0.00019875691 + 0.0013981999) * fVar145 + 0.008333452) *
                          fVar145 + 0.041665796) * fVar145 + 0.16666666) * fVar145 + 0.5) *
                       fVar145 * fVar145) + fVar153;
                  auVar69 = maxps(auVar148,_DAT_00537890);
                  fVar96 = (float)(auVar69._0_4_ & 0x807fffff | 0x3f000000);
                  fVar144 = (float)(auVar69._4_4_ & 0x807fffff | 0x3f000000);
                  fVar121 = (float)(auVar69._8_4_ & 0x807fffff | 0x3f000000);
                  fVar137 = (float)(auVar69._12_4_ & 0x807fffff | 0x3f000000);
                  fVar98 = fVar96 + -1.0 + (float)(-(uint)(fVar96 < 0.70710677) & (uint)fVar96);
                  fVar145 = fVar144 + -1.0 + (float)(-(uint)(fVar144 < 0.70710677) & (uint)fVar144);
                  fVar136 = fVar121 + -1.0 + (float)(-(uint)(fVar121 < 0.70710677) & (uint)fVar121);
                  fVar138 = fVar137 + -1.0 + (float)(-(uint)(fVar137 < 0.70710677) & (uint)fVar137);
                  auVar110._0_8_ =
                       CONCAT44(-(uint)(auVar148._4_4_ <= 0.0),-(uint)(auVar148._0_4_ <= 0.0)) &
                       0x7fffffff7fffffff;
                  auVar110._8_4_ = -(uint)(auVar148._8_4_ <= 0.0) & 0x7fffffff;
                  auVar110._12_4_ = -(uint)(auVar148._12_4_ <= 0.0) & 0x7fffffff;
                  auVar142._0_4_ =
                       ~-(uint)(auVar148._0_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar69._0_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar96 < 0.70710677) & (uint)fVar150)) * 0.6931472 +
                               fVar98 + (((((((((fVar98 * 0.070376836 + -0.1151461) * fVar98 +
                                               0.116769984) * fVar98 + -0.12420141) * fVar98 +
                                             0.14249323) * fVar98 + -0.16668057) * fVar98 +
                                           0.20000714) * fVar98 + -0.24999994) * fVar98 + 0.3333333)
                                         * fVar98 + -0.5) * fVar98 * fVar98) * -2.0);
                  auVar142._4_4_ =
                       ~-(uint)(auVar148._4_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar69._4_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar144 < 0.70710677) & (uint)fVar151)) * 0.6931472 +
                               fVar145 +
                              (((((((((fVar145 * 0.070376836 + -0.1151461) * fVar145 + 0.116769984)
                                     * fVar145 + -0.12420141) * fVar145 + 0.14249323) * fVar145 +
                                  -0.16668057) * fVar145 + 0.20000714) * fVar145 + -0.24999994) *
                                fVar145 + 0.3333333) * fVar145 + -0.5) * fVar145 * fVar145) * -2.0);
                  auVar142._8_4_ =
                       ~-(uint)(auVar148._8_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar69._8_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar121 < 0.70710677) & (uint)fVar152)) * 0.6931472 +
                               fVar136 +
                              (((((((((fVar136 * 0.070376836 + -0.1151461) * fVar136 + 0.116769984)
                                     * fVar136 + -0.12420141) * fVar136 + 0.14249323) * fVar136 +
                                  -0.16668057) * fVar136 + 0.20000714) * fVar136 + -0.24999994) *
                                fVar136 + 0.3333333) * fVar136 + -0.5) * fVar136 * fVar136) * -2.0);
                  auVar142._12_4_ =
                       ~-(uint)(auVar148._12_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar69._12_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar137 < 0.70710677) & (uint)fVar153)) * 0.6931472 +
                               fVar138 +
                              (((((((((fVar138 * 0.070376836 + -0.1151461) * fVar138 + 0.116769984)
                                     * fVar138 + -0.12420141) * fVar138 + 0.14249323) * fVar138 +
                                  -0.16668057) * fVar138 + 0.20000714) * fVar138 + -0.24999994) *
                                fVar138 + 0.3333333) * fVar138 + -0.5) * fVar138 * fVar138) * -2.0);
                  auVar69 = minps(auVar142 | auVar110,_DAT_005377e0);
                  auVar69 = maxps(auVar69,_DAT_005377f0);
                  fVar121 = auVar69._0_4_ * 1.442695 + 0.5;
                  fVar136 = auVar69._4_4_ * 1.442695 + 0.5;
                  fVar137 = auVar69._8_4_ * 1.442695 + 0.5;
                  fVar138 = auVar69._12_4_ * 1.442695 + 0.5;
                  fVar96 = (float)(int)fVar121;
                  fVar98 = (float)(int)fVar136;
                  fVar144 = (float)(int)fVar137;
                  fVar145 = (float)(int)fVar138;
                  fVar96 = fVar96 - (float)(-(uint)(fVar121 < fVar96) & (uint)fVar150);
                  fVar98 = fVar98 - (float)(-(uint)(fVar136 < fVar98) & (uint)fVar151);
                  fVar144 = fVar144 - (float)(-(uint)(fVar137 < fVar144) & (uint)fVar152);
                  fVar145 = fVar145 - (float)(-(uint)(fVar138 < fVar145) & (uint)fVar153);
                  fVar121 = auVar69._0_4_ - fVar96 * 0.6931472;
                  fVar136 = auVar69._4_4_ - fVar98 * 0.6931472;
                  fVar137 = auVar69._8_4_ - fVar144 * 0.6931472;
                  fVar138 = auVar69._12_4_ - fVar145 * 0.6931472;
                  auVar133._0_4_ =
                       (float)((int)fVar96 * 0x800000 + (int)fVar150) *
                       (fVar121 + fVar150 +
                       (((((fVar121 * 0.00019875691 + 0.0013981999) * fVar121 + 0.008333452) *
                          fVar121 + 0.041665796) * fVar121 + 0.16666666) * fVar121 + 0.5) *
                       fVar121 * fVar121) + fVar150;
                  auVar133._4_4_ =
                       (float)((int)fVar98 * 0x800000 + (int)fVar151) *
                       (fVar136 + fVar151 +
                       (((((fVar136 * 0.00019875691 + 0.0013981999) * fVar136 + 0.008333452) *
                          fVar136 + 0.041665796) * fVar136 + 0.16666666) * fVar136 + 0.5) *
                       fVar136 * fVar136) + fVar151;
                  auVar133._8_4_ =
                       (float)((int)fVar144 * 0x800000 + (int)fVar152) *
                       (fVar137 + fVar152 +
                       (((((fVar137 * 0.00019875691 + 0.0013981999) * fVar137 + 0.008333452) *
                          fVar137 + 0.041665796) * fVar137 + 0.16666666) * fVar137 + 0.5) *
                       fVar137 * fVar137) + fVar152;
                  auVar133._12_4_ =
                       (float)((int)fVar145 * 0x800000 + (int)fVar153) *
                       (fVar138 + fVar153 +
                       (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) *
                          fVar138 + 0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5) *
                       fVar138 * fVar138) + fVar153;
                  auVar69 = divps(_DAT_00538270,auVar133);
                  auVar146._0_4_ = (auVar69._0_4_ + -1.0) * fVar77;
                  auVar146._4_4_ = (auVar69._4_4_ + -1.0) * fVar81;
                  auVar146._8_4_ = (auVar69._8_4_ + -1.0) * fVar85;
                  auVar146._12_4_ = (auVar69._12_4_ + -1.0) * fVar94;
                  auVar69 = minps(auVar66,_DAT_005377e0);
                  auVar69 = maxps(auVar69,_DAT_005377f0);
                  fVar77 = auVar69._0_4_ * 1.442695 + 0.5;
                  fVar81 = auVar69._4_4_ * 1.442695 + 0.5;
                  fVar85 = auVar69._8_4_ * 1.442695 + 0.5;
                  fVar94 = auVar69._12_4_ * 1.442695 + 0.5;
                  fVar96 = (float)(int)fVar77;
                  fVar98 = (float)(int)fVar81;
                  fVar144 = (float)(int)fVar85;
                  fVar145 = (float)(int)fVar94;
                  fVar96 = fVar96 - (float)(-(uint)(fVar77 < fVar96) & (uint)fVar150);
                  fVar98 = fVar98 - (float)(-(uint)(fVar81 < fVar98) & (uint)fVar151);
                  fVar144 = fVar144 - (float)(-(uint)(fVar85 < fVar144) & (uint)fVar152);
                  fVar145 = fVar145 - (float)(-(uint)(fVar94 < fVar145) & (uint)fVar153);
                  fVar77 = auVar69._0_4_ - fVar96 * 0.6931472;
                  fVar81 = auVar69._4_4_ - fVar98 * 0.6931472;
                  fVar85 = auVar69._8_4_ - fVar144 * 0.6931472;
                  fVar94 = auVar69._12_4_ - fVar145 * 0.6931472;
                  auVar87._0_4_ =
                       (float)((int)fVar96 * 0x800000 + (int)fVar150) *
                       (fVar77 + fVar150 +
                       (((((fVar77 * 0.00019875691 + 0.0013981999) * fVar77 + 0.008333452) * fVar77
                         + 0.041665796) * fVar77 + 0.16666666) * fVar77 + 0.5) * fVar77 * fVar77) +
                       fVar150;
                  auVar87._4_4_ =
                       (float)((int)fVar98 * 0x800000 + (int)fVar151) *
                       (fVar81 + fVar151 +
                       (((((fVar81 * 0.00019875691 + 0.0013981999) * fVar81 + 0.008333452) * fVar81
                         + 0.041665796) * fVar81 + 0.16666666) * fVar81 + 0.5) * fVar81 * fVar81) +
                       fVar151;
                  auVar87._8_4_ =
                       (float)((int)fVar144 * 0x800000 + (int)fVar152) *
                       (fVar85 + fVar152 +
                       (((((fVar85 * 0.00019875691 + 0.0013981999) * fVar85 + 0.008333452) * fVar85
                         + 0.041665796) * fVar85 + 0.16666666) * fVar85 + 0.5) * fVar85 * fVar85) +
                       fVar152;
                  auVar87._12_4_ =
                       (float)((int)fVar145 * 0x800000 + (int)fVar153) *
                       (fVar94 + fVar153 +
                       (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) * fVar94
                         + 0.041665796) * fVar94 + 0.16666666) * fVar94 + 0.5) * fVar94 * fVar94) +
                       fVar153;
                  auVar69 = maxps(auVar87,_DAT_00537890);
                  fVar77 = (float)(auVar69._0_4_ & 0x807fffff | 0x3f000000);
                  fVar85 = (float)(auVar69._4_4_ & 0x807fffff | 0x3f000000);
                  fVar96 = (float)(auVar69._8_4_ & 0x807fffff | 0x3f000000);
                  fVar144 = (float)(auVar69._12_4_ & 0x807fffff | 0x3f000000);
                  fVar81 = fVar77 + -1.0 + (float)(-(uint)(fVar77 < 0.70710677) & (uint)fVar77);
                  fVar94 = fVar85 + -1.0 + (float)(-(uint)(fVar85 < 0.70710677) & (uint)fVar85);
                  fVar98 = fVar96 + -1.0 + (float)(-(uint)(fVar96 < 0.70710677) & (uint)fVar96);
                  fVar145 = fVar144 + -1.0 + (float)(-(uint)(fVar144 < 0.70710677) & (uint)fVar144);
                  auVar88._0_8_ =
                       CONCAT44(-(uint)(auVar87._4_4_ <= 0.0),-(uint)(auVar87._0_4_ <= 0.0)) &
                       0x7fffffff7fffffff;
                  auVar88._8_4_ = -(uint)(auVar87._8_4_ <= 0.0) & 0x7fffffff;
                  auVar88._12_4_ = -(uint)(auVar87._12_4_ <= 0.0) & 0x7fffffff;
                  auVar111._0_4_ =
                       ~-(uint)(auVar87._0_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar69._0_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar77 < 0.70710677) & (uint)fVar150)) * 0.6931472 +
                               fVar81 + (((((((((fVar81 * 0.070376836 + -0.1151461) * fVar81 +
                                               0.116769984) * fVar81 + -0.12420141) * fVar81 +
                                             0.14249323) * fVar81 + -0.16668057) * fVar81 +
                                           0.20000714) * fVar81 + -0.24999994) * fVar81 + 0.3333333)
                                         * fVar81 + -0.5) * fVar81 * fVar81) * -2.0);
                  auVar111._4_4_ =
                       ~-(uint)(auVar87._4_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar69._4_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar85 < 0.70710677) & (uint)fVar151)) * 0.6931472 +
                               fVar94 + (((((((((fVar94 * 0.070376836 + -0.1151461) * fVar94 +
                                               0.116769984) * fVar94 + -0.12420141) * fVar94 +
                                             0.14249323) * fVar94 + -0.16668057) * fVar94 +
                                           0.20000714) * fVar94 + -0.24999994) * fVar94 + 0.3333333)
                                         * fVar94 + -0.5) * fVar94 * fVar94) * -2.0);
                  auVar111._8_4_ =
                       ~-(uint)(auVar87._8_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar69._8_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar96 < 0.70710677) & (uint)fVar152)) * 0.6931472 +
                               fVar98 + (((((((((fVar98 * 0.070376836 + -0.1151461) * fVar98 +
                                               0.116769984) * fVar98 + -0.12420141) * fVar98 +
                                             0.14249323) * fVar98 + -0.16668057) * fVar98 +
                                           0.20000714) * fVar98 + -0.24999994) * fVar98 + 0.3333333)
                                         * fVar98 + -0.5) * fVar98 * fVar98) * -2.0);
                  auVar111._12_4_ =
                       ~-(uint)(auVar87._12_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar69._12_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar144 < 0.70710677) & (uint)fVar153)) * 0.6931472 +
                               fVar145 +
                              (((((((((fVar145 * 0.070376836 + -0.1151461) * fVar145 + 0.116769984)
                                     * fVar145 + -0.12420141) * fVar145 + 0.14249323) * fVar145 +
                                  -0.16668057) * fVar145 + 0.20000714) * fVar145 + -0.24999994) *
                                fVar145 + 0.3333333) * fVar145 + -0.5) * fVar145 * fVar145) * -2.0);
                  auVar69 = minps(auVar111 | auVar88,_DAT_005377e0);
                  auVar69 = maxps(auVar69,_DAT_005377f0);
                  fVar96 = auVar69._0_4_ * 1.442695 + 0.5;
                  fVar98 = auVar69._4_4_ * 1.442695 + 0.5;
                  fVar144 = auVar69._8_4_ * 1.442695 + 0.5;
                  fVar145 = auVar69._12_4_ * 1.442695 + 0.5;
                  fVar77 = (float)(int)fVar96;
                  fVar81 = (float)(int)fVar98;
                  fVar85 = (float)(int)fVar144;
                  fVar94 = (float)(int)fVar145;
                  fVar77 = fVar77 - (float)(-(uint)(fVar96 < fVar77) & (uint)fVar150);
                  fVar81 = fVar81 - (float)(-(uint)(fVar98 < fVar81) & (uint)fVar151);
                  fVar85 = fVar85 - (float)(-(uint)(fVar144 < fVar85) & (uint)fVar152);
                  fVar94 = fVar94 - (float)(-(uint)(fVar145 < fVar94) & (uint)fVar153);
                  fVar96 = auVar69._0_4_ - fVar77 * 0.6931472;
                  fVar98 = auVar69._4_4_ - fVar81 * 0.6931472;
                  fVar144 = auVar69._8_4_ - fVar85 * 0.6931472;
                  fVar145 = auVar69._12_4_ - fVar94 * 0.6931472;
                  auVar89._0_4_ =
                       (float)((int)fVar77 * 0x800000 + (int)fVar150) *
                       (fVar96 + fVar150 +
                       (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) * fVar96
                         + 0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5) * fVar96 * fVar96) +
                       fVar150;
                  auVar89._4_4_ =
                       (float)((int)fVar81 * 0x800000 + (int)fVar151) *
                       (fVar98 + fVar151 +
                       (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) * fVar98
                         + 0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5) * fVar98 * fVar98) +
                       fVar151;
                  auVar89._8_4_ =
                       (float)((int)fVar85 * 0x800000 + (int)fVar152) *
                       (fVar144 + fVar152 +
                       (((((fVar144 * 0.00019875691 + 0.0013981999) * fVar144 + 0.008333452) *
                          fVar144 + 0.041665796) * fVar144 + 0.16666666) * fVar144 + 0.5) *
                       fVar144 * fVar144) + fVar152;
                  auVar89._12_4_ =
                       (float)((int)fVar94 * 0x800000 + (int)fVar153) *
                       (fVar145 + fVar153 +
                       (((((fVar145 * 0.00019875691 + 0.0013981999) * fVar145 + 0.008333452) *
                          fVar145 + 0.041665796) * fVar145 + 0.16666666) * fVar145 + 0.5) *
                       fVar145 * fVar145) + fVar153;
                  auVar69 = divps(_DAT_00538270,auVar89);
                  auVar114._0_4_ = auVar69._0_4_ + -1.0;
                  auVar114._4_4_ = auVar69._4_4_ + -1.0;
                  auVar114._8_4_ = auVar69._8_4_ + -1.0;
                  auVar114._12_4_ = auVar69._12_4_ + -1.0;
                  goto LAB_0039bba7;
                case 6:
                  pfVar34 = (float *)(this->super_ConvolutionDepthWise).activation_params.data;
                  fVar96 = *pfVar34;
                  fVar98 = pfVar34[1];
                  auVar149._0_4_ = fVar96 * fVar77 + fVar98;
                  auVar149._4_4_ = fVar96 * fVar81 + fVar98;
                  auVar149._8_4_ = fVar96 * fVar85 + fVar98;
                  auVar149._12_4_ = fVar96 * fVar94 + fVar98;
                  auVar130 = maxps(auVar149,auVar69);
                  auVar130 = minps(auVar130,auVar63);
                  auVar146._0_4_ = auVar130._0_4_ * fVar77;
                  auVar146._4_4_ = auVar130._4_4_ * fVar81;
                  auVar146._8_4_ = auVar130._8_4_ * fVar85;
                  auVar146._12_4_ = auVar130._12_4_ * fVar94;
                  auVar113._0_4_ = fVar96 * auVar66._0_4_ + fVar98;
                  auVar113._4_4_ = fVar96 * auVar66._4_4_ + fVar98;
                  auVar113._8_4_ = fVar96 * fVar65 + fVar98;
                  auVar113._12_4_ = fVar96 * fVar74 + fVar98;
                  auVar69 = maxps(auVar113,auVar69);
                  auVar114 = minps(auVar69,auVar63);
LAB_0039bba7:
                  auVar108._0_4_ = auVar114._0_4_ * auVar66._0_4_;
                  auVar108._4_4_ = auVar114._4_4_ * auVar66._4_4_;
                  auVar108._8_4_ = auVar114._8_4_ * fVar65;
                  auVar108._12_4_ = auVar114._12_4_ * fVar74;
                }
switchD_0039b501_caseD_1:
                if (iVar49 < 0x65) {
                  *pauVar47 = auVar146;
                  pauVar47[1] = auVar108;
                  pauVar47 = pauVar47 + 2;
                }
                else {
                  pvVar11 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
                  pfVar34 = (float *)((long)pvVar11 + uVar44 * 0x20);
                  pfVar1 = (float *)((long)pvVar11 + uVar44 * 0x20 + 0x10);
                  fVar65 = *pfVar34 * auVar146._0_4_;
                  fVar74 = pfVar34[1] * auVar146._4_4_;
                  fVar77 = pfVar34[2] * auVar146._8_4_;
                  fVar81 = pfVar34[3] * auVar146._12_4_;
                  fVar85 = *pfVar1 * auVar108._0_4_;
                  fVar94 = pfVar1[1] * auVar108._4_4_;
                  fVar96 = pfVar1[2] * auVar108._8_4_;
                  fVar98 = pfVar1[3] * auVar108._12_4_;
                  auVar68._0_4_ = (int)((float)((uint)fVar65 & 0x80000000 | 0x3f000000) + fVar65);
                  auVar68._4_4_ = (int)((float)((uint)fVar74 & 0x80000000 | 0x3f000000) + fVar74);
                  auVar68._8_4_ = (int)((float)((uint)fVar77 & 0x80000000 | 0x3f000000) + fVar77);
                  auVar68._12_4_ = (int)((float)((uint)fVar81 & 0x80000000 | 0x3f000000) + fVar81);
                  auVar92._0_4_ = (int)((float)((uint)fVar85 & 0x80000000 | 0x3f000000) + fVar85);
                  auVar92._4_4_ = (int)((float)((uint)fVar94 & 0x80000000 | 0x3f000000) + fVar94);
                  auVar92._8_4_ = (int)((float)((uint)fVar96 & 0x80000000 | 0x3f000000) + fVar96);
                  auVar92._12_4_ = (int)((float)((uint)fVar98 & 0x80000000 | 0x3f000000) + fVar98);
                  auVar69 = packssdw(auVar68,auVar92);
                  sVar143 = auVar69._0_2_;
                  uVar64 = (ushort)(0x7f < sVar143) * 0x7f | (ushort)(0x7f >= sVar143) * sVar143;
                  sVar143 = auVar69._2_2_;
                  uVar71 = (ushort)(0x7f < sVar143) * 0x7f | (ushort)(0x7f >= sVar143) * sVar143;
                  sVar143 = auVar69._4_2_;
                  uVar72 = (ushort)(0x7f < sVar143) * 0x7f | (ushort)(0x7f >= sVar143) * sVar143;
                  sVar143 = auVar69._6_2_;
                  uVar75 = (ushort)(0x7f < sVar143) * 0x7f | (ushort)(0x7f >= sVar143) * sVar143;
                  sVar143 = auVar69._8_2_;
                  uVar76 = (ushort)(0x7f < sVar143) * 0x7f | (ushort)(0x7f >= sVar143) * sVar143;
                  sVar143 = auVar69._10_2_;
                  uVar78 = (ushort)(0x7f < sVar143) * 0x7f | (ushort)(0x7f >= sVar143) * sVar143;
                  sVar143 = auVar69._12_2_;
                  sVar83 = auVar69._14_2_;
                  uVar79 = (ushort)(0x7f < sVar143) * 0x7f | (ushort)(0x7f >= sVar143) * sVar143;
                  uVar82 = (ushort)(0x7f < sVar83) * 0x7f | (ushort)(0x7f >= sVar83) * sVar83;
                  auVar70._0_2_ =
                       (ushort)((short)uVar64 < -0x7f) * -0x7f | ((short)uVar64 >= -0x7f) * uVar64;
                  auVar70._2_2_ =
                       (ushort)((short)uVar71 < -0x7f) * -0x7f | ((short)uVar71 >= -0x7f) * uVar71;
                  auVar70._4_2_ =
                       (ushort)((short)uVar72 < -0x7f) * -0x7f | ((short)uVar72 >= -0x7f) * uVar72;
                  auVar70._6_2_ =
                       (ushort)((short)uVar75 < -0x7f) * -0x7f | ((short)uVar75 >= -0x7f) * uVar75;
                  auVar70._8_2_ =
                       (ushort)((short)uVar76 < -0x7f) * -0x7f | ((short)uVar76 >= -0x7f) * uVar76;
                  auVar70._10_2_ =
                       (ushort)((short)uVar78 < -0x7f) * -0x7f | ((short)uVar78 >= -0x7f) * uVar78;
                  auVar70._12_2_ =
                       (ushort)((short)uVar79 < -0x7f) * -0x7f | ((short)uVar79 >= -0x7f) * uVar79;
                  auVar70._14_2_ =
                       (ushort)((short)uVar82 < -0x7f) * -0x7f | ((short)uVar82 >= -0x7f) * uVar82;
                  auVar69 = packsswb(auVar70,auVar70);
                  *(long *)*pauVar46 = auVar69._0_8_;
                  pauVar46 = (undefined1 (*) [16])((long)*pauVar46 + 8);
                }
              }
            }
            iVar40 = iVar40 + (int)uVar56 * 8;
          }
LAB_0039c6a0:
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
          local_2fc = 0;
          iVar42 = local_2fc;
        }
      }
    }
    else {
      uVar54 = (this->super_ConvolutionDepthWise).num_output;
      iVar36 = (this->super_ConvolutionDepthWise).int8_scale_term;
      if (opt->use_packing_layout == true) {
        if (iVar36 < 0x65) {
          uVar56 = (ulong)((uint)((uVar54 & 3) == 0) * 3 + 1);
        }
        else {
          uVar56 = 1;
          if ((uVar54 & 7) == 0) {
            uVar56 = 8;
          }
        }
      }
      else {
        uVar56 = 1;
      }
      uVar15 = (uint)uVar56;
      uVar60 = (ulong)(uVar15 * 4);
      if (100 < iVar36) {
        uVar60 = uVar56;
      }
      Mat::create(top_blob,iVar40,iVar50,(int)uVar54 / (int)uVar15,uVar60,uVar15,opt->blob_allocator
                 );
      auVar63 = (undefined1  [16])opt_q._48_16_;
      sVar29 = local_2c8.cstep;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar39 = (this->super_ConvolutionDepthWise).group;
        uVar44 = (long)(int)uVar35 / (long)iVar39;
        uVar54 = (this->super_ConvolutionDepthWise).num_output / iVar39;
        iVar39 = (int)uVar44;
        if (opt->use_packing_layout == true) {
          uVar35 = 1;
          if ((uVar44 & 7) == 0) {
            uVar35 = uVar59;
          }
          if (iVar36 < 0x65) {
            _elempack = (uint)((uVar54 & 3) == 0) * 3 + 1;
          }
          else {
            _elempack = 1;
            if ((uVar54 & 7) == 0) {
              _elempack = uVar59;
            }
          }
        }
        else {
          uVar35 = 1;
          _elempack = 1;
        }
        opt_q.blob_allocator =
             (Allocator *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
        opt_q._0_8_ = local_2c8.data;
        opt_q.workspace_allocator =
             (Allocator *)CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize);
        opt_q.openmp_blocktime = local_2c8.elempack;
        opt_q._32_8_ = local_2c8.allocator;
        opt_q._44_4_ = local_2c8.w;
        opt_q.vulkan_device_index = local_2c8.dims;
        opt_q.use_local_pool_allocator = (bool)(undefined1)local_2c8.d;
        opt_q.use_shader_local_memory = (bool)local_2c8.d._1_1_;
        opt_q.use_cooperative_matrix = (bool)local_2c8.d._2_1_;
        opt_q.use_winograd23_convolution = (bool)local_2c8.d._3_1_;
        opt_q.flush_denormals = local_2c8.h;
        opt_q._60_4_ = auVar63._12_4_;
        opt_q.use_winograd43_convolution = (bool)(undefined1)local_2c8.c;
        opt_q.use_winograd63_convolution = (bool)local_2c8.c._1_1_;
        opt_q.use_a53_a55_optimized_kernel = (bool)local_2c8.c._2_1_;
        opt_q.use_fp16_uniform = (bool)local_2c8.c._3_1_;
        if (opt_q.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + 1;
          UNLOCK();
        }
        if ((int)uVar35 < iVar53) {
          _top_rescale = *(void **)opt;
          local_218 = opt->workspace_allocator;
          iStack_210 = opt->openmp_blocktime;
          unique0x1000175b = opt->use_winograd_convolution;
          unique0x1000175c = opt->use_sgemm_convolution;
          unique0x1000175d = opt->use_int8_inference;
          unique0x1000175e = opt->use_vulkan_compute;
          local_208 = *(Allocator **)&opt->use_bf16_storage;
          _iStack_200 = *(undefined8 *)&opt->vulkan_device_index;
          _local_1f8 = *(undefined8 *)&opt->flush_denormals;
          _iStack_1f0 = *(undefined8 *)&opt->use_winograd43_convolution;
          pAStack_220 = opt->workspace_allocator;
          convert_packing(&local_2c8,(Mat *)&opt_q,uVar35,(Option *)&top_rescale);
          if ((opt_q._0_8_ != 0) && ((long)(int)opt_q._56_4_ * sVar29 != 0)) goto LAB_0039bd71;
          iVar42 = -100;
        }
        else {
LAB_0039bd71:
          _top_rescale = top_blob->data;
          pAStack_220 = (Allocator *)top_blob->refcount;
          local_218 = (Allocator *)top_blob->elemsize;
          iStack_210 = top_blob->elempack;
          local_208 = top_blob->allocator;
          iStack_200 = top_blob->dims;
          iStack_1fc = top_blob->w;
          local_1f8 = top_blob->h;
          iStack_1f4 = top_blob->d;
          iStack_1f0 = top_blob->c;
          local_1e8 = top_blob->cstep;
          if (pAStack_220 != (Allocator *)0x0) {
            LOCK();
            *(int *)&pAStack_220->_vptr_Allocator = *(int *)&pAStack_220->_vptr_Allocator + 1;
            UNLOCK();
          }
          if (_elempack < uVar15) {
            Mat::create((Mat *)&top_rescale,iVar40,iVar50,
                        (this->super_ConvolutionDepthWise).num_output / (int)_elempack,
                        (ulong)((byte)((ushort)uVar60 / (ushort)(byte)uVar56) * _elempack),_elempack
                        ,opt->workspace_allocator);
            iVar42 = -100;
            if ((_top_rescale != (void *)0x0) && ((long)iStack_1f0 * local_1e8 != 0))
            goto LAB_0039be40;
          }
          else {
LAB_0039be40:
            iVar40 = 0;
            iVar36 = 0;
            lVar43 = 0;
            do {
              auVar63 = (undefined1  [16])opt_q._48_16_;
              uVar30 = opt_q._40_8_;
              if ((this->super_ConvolutionDepthWise).group <= lVar43) {
                if (_elempack < uVar15) {
                  convert_packing((Mat *)&top_rescale,top_blob,uVar15,opt);
                  iVar42 = -100;
                  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
                  break;
                }
                else if ((Mat *)&top_rescale != top_blob) {
                  if (pAStack_220 != (Allocator *)0x0) {
                    LOCK();
                    *(int *)&pAStack_220->_vptr_Allocator =
                         *(int *)&pAStack_220->_vptr_Allocator + 1;
                    UNLOCK();
                  }
                  piVar13 = top_blob->refcount;
                  if (piVar13 != (int *)0x0) {
                    LOCK();
                    *piVar13 = *piVar13 + -1;
                    UNLOCK();
                    if (*piVar13 == 0) {
                      if (top_blob->allocator == (Allocator *)0x0) {
                        free(top_blob->data);
                      }
                      else {
                        (*top_blob->allocator->_vptr_Allocator[3])();
                      }
                    }
                  }
                  top_blob->data = _top_rescale;
                  top_blob->refcount = (int *)pAStack_220;
                  top_blob->elemsize = (size_t)local_218;
                  top_blob->elempack = iStack_210;
                  top_blob->allocator = local_208;
                  top_blob->dims = iStack_200;
                  top_blob->w = iStack_1fc;
                  top_blob->h = local_1f8;
                  top_blob->d = iStack_1f4;
                  top_blob->c = iStack_1f0;
                  top_blob->cstep = local_1e8;
                }
                iVar42 = 0;
                break;
              }
              local_178 = iVar39 / (int)uVar35;
              _scale_out = (void *)((long)(iVar40 / (int)uVar35) * sVar29 *
                                    (long)opt_q.workspace_allocator + opt_q._0_8_);
              local_1a8 = (int *)0x0;
              local_1a0 = opt_q.workspace_allocator;
              local_198 = opt_q.openmp_blocktime;
              local_190 = (long *)opt_q._32_8_;
              local_184 = opt_q.use_reserved_1;
              bStack_183 = opt_q.use_image_storage;
              bStack_182 = opt_q.use_tensor_storage;
              bStack_181 = opt_q.use_reserved_2;
              local_180 = opt_q.flush_denormals;
              local_17c = opt_q.use_local_pool_allocator;
              bStack_17b = opt_q.use_shader_local_memory;
              bStack_17a = opt_q.use_cooperative_matrix;
              bStack_179 = opt_q.use_winograd23_convolution;
              local_170 = ((long)(int)opt_q._52_4_ * (long)opt_q.workspace_allocator *
                           (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_ + 0xfU &
                          0xfffffffffffffff0) / (ulong)opt_q.workspace_allocator;
              opt_q.vulkan_device_index = (int)uVar30;
              local_188 = opt_q.vulkan_device_index;
              m_1.c = (int)uVar54 / (int)_elempack;
              m_1.data = (void *)((long)(iVar36 / (int)_elempack) * local_1e8 * (long)local_218 +
                                 (long)_top_rescale);
              m_1.refcount = (int *)0x0;
              m_1.elemsize = (size_t)local_218;
              m_1.elempack = iStack_210;
              m_1.allocator = local_208;
              m_1.w = iStack_1fc;
              m_1.h = local_1f8;
              m_1.d = iStack_1f4;
              m_1.cstep = ((long)iStack_1f4 * (long)local_218 * (long)local_1f8 * (long)iStack_1fc +
                           0xfU & 0xfffffffffffffff0) / (ulong)local_218;
              m_1.dims = iStack_200;
              pLVar14 = (this->group_ops).
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar43];
              opt_g.lightmode = opt->lightmode;
              opt_g.use_shader_pack8 = opt->use_shader_pack8;
              opt_g.use_subgroup_ops = opt->use_subgroup_ops;
              opt_g.use_reserved_0 = opt->use_reserved_0;
              opt_g.num_threads = opt->num_threads;
              opt_g.workspace_allocator = opt->workspace_allocator;
              opt_g.openmp_blocktime = opt->openmp_blocktime;
              opt_g.use_winograd_convolution = opt->use_winograd_convolution;
              opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
              opt_g.use_int8_inference = opt->use_int8_inference;
              opt_g.use_vulkan_compute = opt->use_vulkan_compute;
              opt_g.use_bf16_storage = opt->use_bf16_storage;
              opt_g.use_fp16_packed = opt->use_fp16_packed;
              opt_g.use_fp16_storage = opt->use_fp16_storage;
              opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
              opt_g.use_int8_packed = opt->use_int8_packed;
              opt_g.use_int8_storage = opt->use_int8_storage;
              opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
              opt_g.use_packing_layout = opt->use_packing_layout;
              opt_g.vulkan_device_index = opt->vulkan_device_index;
              opt_g.use_reserved_1 = opt->use_reserved_1;
              opt_g.use_image_storage = opt->use_image_storage;
              opt_g.use_tensor_storage = opt->use_tensor_storage;
              opt_g.use_reserved_2 = opt->use_reserved_2;
              opt_g.flush_denormals = opt->flush_denormals;
              opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
              opt_g.use_shader_local_memory = opt->use_shader_local_memory;
              opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
              opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
              opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
              opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
              opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
              opt_g.use_fp16_uniform = opt->use_fp16_uniform;
              opt_g.use_int8_uniform = opt->use_int8_uniform;
              opt_g.use_reserved_9 = opt->use_reserved_9;
              opt_g.use_reserved_10 = opt->use_reserved_10;
              opt_g.use_reserved_11 = opt->use_reserved_11;
              opt_g.blob_allocator = local_208;
              opt_q._40_8_ = uVar30;
              opt_q._48_16_ = auVar63;
              iVar42 = (*pLVar14->_vptr_Layer[7])(pLVar14,&scale_out,&m_1,&opt_g);
              if (m_1.refcount != (int *)0x0) {
                LOCK();
                *m_1.refcount = *m_1.refcount + -1;
                UNLOCK();
                if (*m_1.refcount == 0) {
                  if (m_1.allocator == (Allocator *)0x0) {
                    free(m_1.data);
                  }
                  else {
                    (*(m_1.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              if (local_1a8 != (int *)0x0) {
                LOCK();
                *local_1a8 = *local_1a8 + -1;
                UNLOCK();
                if (*local_1a8 == 0) {
                  if (local_190 == (long *)0x0) {
                    free(_scale_out);
                  }
                  else {
                    (**(code **)(*local_190 + 0x18))();
                  }
                }
              }
              lVar43 = lVar43 + 1;
              iVar36 = iVar36 + uVar54;
              iVar40 = iVar40 + iVar39;
            } while (iVar42 == 0);
          }
          if (pAStack_220 != (Allocator *)0x0) {
            LOCK();
            *(int *)&pAStack_220->_vptr_Allocator = *(int *)&pAStack_220->_vptr_Allocator + -1;
            UNLOCK();
            if (*(int *)&pAStack_220->_vptr_Allocator == 0) {
              if (local_208 == (Allocator *)0x0) {
                free(_top_rescale);
              }
              else {
                (*local_208->_vptr_Allocator[3])();
              }
            }
          }
        }
        if (opt_q.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
          UNLOCK();
          if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator == 0) {
            if (opt_q._32_8_ == 0) {
              free((void *)opt_q._0_8_);
            }
            else {
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
      }
    }
  }
  local_2fc = iVar42;
  piVar13 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_2c8.allocator == (Allocator *)0x0) {
        free(local_2c8.data);
      }
      else {
        (*(local_2c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_0039d2df:
  if (local_168.refcount != (int *)0x0) {
    LOCK();
    *local_168.refcount = *local_168.refcount + -1;
    UNLOCK();
    if (*local_168.refcount == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        free(local_168.data);
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return local_2fc;
}

Assistant:

int ConvolutionDepthWise_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
        if (bottom_blob_int8.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}